

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibTable.cpp
# Opt level: O3

int lib::table::Unpack(State *state)

{
  bool bVar1;
  int iVar2;
  Table *this;
  size_t sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  Value VVar8;
  StackAPI api;
  StackAPI local_60;
  anon_union_8_9_8deb4486_for_Value_0 local_50;
  ValueT local_48;
  anon_union_8_9_8deb4486_for_Value_0 local_40;
  undefined4 local_38;
  
  luna::StackAPI::StackAPI(&local_60,state);
  iVar5 = 1;
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT,luna::ValueT>
                    (&local_60,1,ValueT_Table,ValueT_Number,ValueT_Number);
  iVar4 = 0;
  if (bVar1) {
    iVar2 = luna::StackAPI::GetStackSize(&local_60);
    iVar4 = 0;
    this = luna::StackAPI::GetTable(&local_60,0);
    sVar3 = luna::Table::ArraySize(this);
    iVar6 = (int)sVar3;
    if (1 < iVar2) {
      dVar7 = luna::StackAPI::GetNumber(&local_60,1);
      iVar5 = (int)dVar7;
      if (iVar2 != 2) {
        dVar7 = luna::StackAPI::GetNumber(&local_60,2);
        iVar6 = (int)dVar7;
      }
    }
    local_38 = 2;
    if (iVar5 <= iVar6) {
      iVar4 = iVar5;
      do {
        local_40.num_ = (double)iVar4;
        VVar8 = luna::Table::GetValue(this,(Value *)&local_40);
        local_50 = VVar8.field_0;
        local_48 = VVar8.type_;
        luna::StackAPI::PushValue(&local_60,(Value *)&local_50);
        iVar4 = iVar4 + 1;
      } while (iVar6 + 1 != iVar4);
      iVar4 = (iVar6 + 1) - iVar5;
    }
  }
  return iVar4;
}

Assistant:

int Unpack(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_Table,
                           luna::ValueT_Number, luna::ValueT_Number))
            return 0;

        auto params = api.GetStackSize();
        auto table = api.GetTable(0);

        int begin = 1;
        int end = table->ArraySize();
        if (params > 1)
            begin = static_cast<int>(api.GetNumber(1));
        if (params > 2)
            end = static_cast<int>(api.GetNumber(2));

        int count = 0;
        luna::Value key;
        key.type_ = luna::ValueT_Number;
        for (int i = begin; i <= end; ++i)
        {
            key.num_ = i;
            api.PushValue(table->GetValue(key));
            ++count;
        }

        return count;
    }